

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void scalarFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  void *pKey;
  uchar *data;
  undefined8 *puVar1;
  sqlite3_context *psVar2;
  Fts3Hash *in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  char *zErr;
  int n;
  void *pOld;
  int nName;
  uchar *zName;
  void *pPtr;
  Fts3Hash *pHash;
  _func_void_void_ptr *in_stack_ffffffffffffffa8;
  sqlite3_context *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  sqlite3_context *in_stack_ffffffffffffffc0;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  pKey = sqlite3_user_data(in_RDI);
  data = sqlite3_value_text((sqlite3_value *)0x1ba5e7);
  sqlite3_value_bytes((sqlite3_value *)0x1ba5f9);
  if (in_ESI == 2) {
    in_stack_ffffffffffffffbc = sqlite3_value_bytes((sqlite3_value *)0x1ba619);
    if ((data == (uchar *)0x0) || (in_stack_ffffffffffffffbc != 8)) {
      sqlite3_result_error(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,0);
      return;
    }
    puVar1 = (undefined8 *)
             sqlite3_value_blob((sqlite3_value *)CONCAT44(8,in_stack_ffffffffffffffb8));
    psVar2 = (sqlite3_context *)*puVar1;
    in_stack_ffffffffffffffc0 =
         (sqlite3_context *)sqlite3Fts3HashInsert(in_RDX,pKey,(int)((ulong)psVar2 >> 0x20),data);
    if (in_stack_ffffffffffffffc0 == psVar2) {
      sqlite3_result_error(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,0);
      return;
    }
  }
  else {
    if (data != (uchar *)0x0) {
      pvVar3 = sqlite3Fts3HashFind((Fts3Hash *)in_stack_ffffffffffffffc0,
                                   (void *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8),
                                   (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
    if (pvVar3 == (void *)0x0) {
      psVar2 = (sqlite3_context *)sqlite3_mprintf("unknown tokenizer: %s",data);
      sqlite3_result_error(psVar2,(char *)in_stack_ffffffffffffffa8,0);
      sqlite3_free((void *)0x1ba702);
      return;
    }
  }
  sqlite3_result_blob(in_stack_ffffffffffffffc0,
                      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
  return;
}

Assistant:

static void scalarFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Fts3Hash *pHash;
  void *pPtr = 0;
  const unsigned char *zName;
  int nName;

  assert( argc==1 || argc==2 );

  pHash = (Fts3Hash *)sqlite3_user_data(context);

  zName = sqlite3_value_text(argv[0]);
  nName = sqlite3_value_bytes(argv[0])+1;

  if( argc==2 ){
    void *pOld;
    int n = sqlite3_value_bytes(argv[1]);
    if( zName==0 || n!=sizeof(pPtr) ){
      sqlite3_result_error(context, "argument type mismatch", -1);
      return;
    }
    pPtr = *(void **)sqlite3_value_blob(argv[1]);
    pOld = sqlite3Fts3HashInsert(pHash, (void *)zName, nName, pPtr);
    if( pOld==pPtr ){
      sqlite3_result_error(context, "out of memory", -1);
      return;
    }
  }else{
    if( zName ){
      pPtr = sqlite3Fts3HashFind(pHash, zName, nName);
    }
    if( !pPtr ){
      char *zErr = sqlite3_mprintf("unknown tokenizer: %s", zName);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
  }

  sqlite3_result_blob(context, (void *)&pPtr, sizeof(pPtr), SQLITE_TRANSIENT);
}